

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  _Setprecision _Var2;
  time_t tVar3;
  ostream *poVar4;
  double dVar5;
  int local_2cc;
  int idim_3;
  double metropolis;
  double ham_fin;
  double ham_init;
  int idim_2;
  double backup_x [3];
  int iter;
  int naccept;
  ofstream outputfile;
  int local_84;
  int local_80;
  int idim_1;
  int jdim;
  int idim;
  double A [3] [3];
  double local_28;
  double x [3];
  
  x[2]._4_4_ = 0;
  _jdim = 1.0;
  A[1][0] = 2.0;
  A[2][1] = 2.0;
  A[0][0] = 1.0;
  A[0][1] = 1.0;
  A[1][1] = 1.0;
  for (idim_1 = 1; idim_1 < 3; idim_1 = idim_1 + 1) {
    for (local_80 = 0; local_80 < idim_1; local_80 = local_80 + 1) {
      *(undefined8 *)(&jdim + (long)idim_1 * 6 + (long)local_80 * 2) =
           *(undefined8 *)(&jdim + (long)local_80 * 6 + (long)idim_1 * 2);
    }
  }
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
    x[(long)local_84 + -1] = 0.0;
  }
  std::ofstream::ofstream(&iter,"output.txt",0x10);
  backup_x[2]._4_4_ = 0;
  for (backup_x[2]._0_4_ = 0; backup_x[2]._0_4_ < 10000; backup_x[2]._0_4_ = backup_x[2]._0_4_ + 1)
  {
    for (ham_init._4_4_ = 0; ham_init._4_4_ < 3; ham_init._4_4_ = ham_init._4_4_ + 1) {
      *(double *)(&stack0xfffffffffffffd58 + (long)ham_init._4_4_ * 8) =
           x[(long)ham_init._4_4_ + -1];
    }
    Molecular_Dynamics((double (*) [3])&local_28,(double (*) [3])&jdim,&ham_fin,&metropolis);
    iVar1 = rand();
    dVar5 = exp(ham_fin - metropolis);
    if (dVar5 <= (double)iVar1 / 2147483647.0) {
      for (local_2cc = 0; local_2cc < 3; local_2cc = local_2cc + 1) {
        x[(long)local_2cc + -1] = *(double *)(&stack0xfffffffffffffd58 + (long)local_2cc * 8);
      }
    }
    else {
      backup_x[2]._4_4_ = backup_x[2]._4_4_ + 1;
    }
    if ((backup_x[2]._0_4_ + 1) % 10 == 0) {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
      _Var2 = std::setprecision(6);
      poVar4 = std::operator<<(poVar4,_Var2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
      poVar4 = std::operator<<(poVar4,"   ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,x[0]);
      poVar4 = std::operator<<(poVar4,"   ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,x[1]);
      poVar4 = std::operator<<(poVar4,"   ");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(double)backup_x[2]._4_4_ / ((double)backup_x[2]._0_4_ + 1.0));
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&iter,std::fixed);
      _Var2 = std::setprecision(6);
      poVar4 = std::operator<<(poVar4,_Var2);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
      poVar4 = std::operator<<(poVar4,"   ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,x[0]);
      poVar4 = std::operator<<(poVar4,"   ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,x[1]);
      poVar4 = std::operator<<(poVar4,"   ");
      poVar4 = (ostream *)
               std::ostream::operator<<
                         (poVar4,(double)backup_x[2]._4_4_ / ((double)backup_x[2]._0_4_ + 1.0));
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  std::ofstream::close();
  x[2]._4_4_ = 0;
  std::ofstream::~ofstream(&iter);
  return x[2]._4_4_;
}

Assistant:

int main() {
    double x[ndim];
    double A[ndim][ndim];

    A[0][0] = 1e0;
    A[1][1] = 2e0;
    A[2][2] = 2e0;
    A[0][1] = 1e0;
    A[0][2] = 1e0;
    A[1][2] = 1e0;
    for (int idim = 1; idim < ndim; idim++) {
        for (int jdim = 0; jdim < idim; jdim++) {
            A[idim][jdim] = A[jdim][idim];
        }
    }
    srand((unsigned) time(NULL));

    for (int idim = 0; idim < ndim; idim++) {
        x[idim] = 0e0;
    }

    std::ofstream outputfile("output.txt");
    int naccept = 0;

    for (int iter = 0; iter < niter; iter++) {
        double backup_x[ndim];
        for (int idim = 0; idim < ndim; idim++) {
            backup_x[idim] = x[idim];
        }
        double ham_init, ham_fin;
        Molecular_Dynamics(x, A, ham_init, ham_fin);
        double metropolis = (double) rand() / RAND_MAX;
        if (exp(ham_init - ham_fin) > metropolis) {
            naccept++;
        } else {
            for (int idim = 0; idim < ndim; idim++) {
                x[idim] = backup_x[idim];
            }
        }
        if ((iter + 1) % 10 == 0) {
            std::cout << std::fixed << std::setprecision(6)
                      << x[0] << "   "
                      << x[1] << "   "
                      << x[2] << "   "
                      << ((double) naccept) / ((double) iter + 1)
                      << std::endl;

            outputfile << std::fixed << std::setprecision(6)
                       << x[0] << "   "
                       << x[1] << "   "
                       << x[2] << "   "
                       << ((double) naccept) / ((double) iter + 1)
                       << std::endl;
        }
    }
    outputfile.close();
    return 0;
}